

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int coresume(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  lua_State *co;
  int status;
  lua_State *L_local;
  
  L_00 = lua_tothread(L,1);
  if (L_00 == (lua_State *)0x0) {
    luaL_argerror(L,1,"coroutine expected");
  }
  iVar1 = lua_resume(L_00,L,0);
  if ((iVar1 == 0) || (iVar1 == 1)) {
    lua_pushboolean(L,1);
    L_local._4_4_ = 1;
  }
  else {
    lua_pushboolean(L,0);
    lua_rotate(L,-2,1);
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int coresume (lua_State *L) {
  int status;
  lua_State *co = lua_tothread(L, 1);
  luaL_argcheck(L, co, 1, "coroutine expected");
  status = lua_resume(co, L, 0);
  if (status != LUA_OK && status != LUA_YIELD) {
    lua_pushboolean(L, 0);
    lua_insert(L, -2);
    return 2;  /* return false + error message */
  }
  else {
    lua_pushboolean(L, 1);
    return 1;
  }
}